

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

void RadialFetchPlain<GradientBase64>::fetch
               (BlendType *buffer,BlendType *end,Operator *op,QSpanData *data,qreal det,
               qreal delta_det,qreal delta_delta_det,qreal b,qreal delta_b)

{
  Type TVar1;
  double dVar2;
  
  if ((op->field_16).radial.extended == false) {
    if (buffer < end) {
      do {
        if (det < 0.0) {
          TVar1.rgba = 0;
        }
        else {
          if (det < 0.0) {
            dVar2 = sqrt(det);
          }
          else {
            dVar2 = SQRT(det);
          }
          TVar1 = GradientBase64::fetchSingle(&(data->field_23).gradient,dVar2 - b);
        }
        buffer->rgba = TVar1.rgba;
        buffer = buffer + 1;
        det = det + delta_det;
        delta_det = delta_det + delta_delta_det;
        b = b + delta_b;
      } while (buffer < end);
    }
  }
  else if (buffer < end) {
    do {
      if (det < 0.0) {
        TVar1.rgba = 0;
      }
      else {
        if (det < 0.0) {
          dVar2 = sqrt(det);
        }
        else {
          dVar2 = SQRT(det);
        }
        if (0.0 <= (op->field_16).linear.l * (dVar2 - b) + *(double *)((long)&data->field_23 + 0x30)
           ) {
          TVar1 = GradientBase64::fetchSingle(&(data->field_23).gradient,dVar2 - b);
        }
        else {
          TVar1.rgba = 0;
        }
      }
      buffer->rgba = TVar1.rgba;
      det = det + delta_det;
      delta_det = delta_det + delta_delta_det;
      b = b + delta_b;
      buffer = buffer + 1;
    } while (buffer < end);
  }
  return;
}

Assistant:

static void fetch(BlendType *buffer, BlendType *end,
                      const Operator *op, const QSpanData *data, qreal det,
                      qreal delta_det, qreal delta_delta_det, qreal b, qreal delta_b)
    {
        if (op->radial.extended) {
            while (buffer < end) {
                BlendType result = GradientBase::null();
                if (det >= 0) {
                    qreal w = qSqrt(det) - b;
                    if (data->gradient.radial.focal.radius + op->radial.dr * w >= 0)
                        result = GradientBase::fetchSingle(data->gradient, w);
                }

                *buffer = result;

                det += delta_det;
                delta_det += delta_delta_det;
                b += delta_b;

                ++buffer;
            }
        } else {
            while (buffer < end) {
                BlendType result = GradientBase::null();
                if (det >= 0) {
                    qreal w = qSqrt(det) - b;
                    result = GradientBase::fetchSingle(data->gradient, w);
                }

                *buffer++ = result;

                det += delta_det;
                delta_det += delta_delta_det;
                b += delta_b;
            }
        }
    }